

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void Curl_printable_address(Curl_addrinfo *ai,char *buf,size_t bufsize)

{
  in6_addr *ipaddr6;
  sockaddr_in6 *sa6;
  in_addr *ipaddr4;
  sockaddr_in *sa4;
  size_t bufsize_local;
  char *buf_local;
  Curl_addrinfo *ai_local;
  
  *buf = '\0';
  if (ai->ai_family == 2) {
    inet_ntop(ai->ai_family,ai->ai_addr->sa_data + 2,buf,(socklen_t)bufsize);
  }
  else if (ai->ai_family == 10) {
    inet_ntop(ai->ai_family,ai->ai_addr->sa_data + 6,buf,(socklen_t)bufsize);
  }
  return;
}

Assistant:

void Curl_printable_address(const struct Curl_addrinfo *ai, char *buf,
                            size_t bufsize)
{
  DEBUGASSERT(bufsize);
  buf[0] = 0;

  switch(ai->ai_family) {
  case AF_INET: {
    const struct sockaddr_in *sa4 = (const void *)ai->ai_addr;
    const struct in_addr *ipaddr4 = &sa4->sin_addr;
    (void)Curl_inet_ntop(ai->ai_family, (const void *)ipaddr4, buf, bufsize);
    break;
  }
#ifdef USE_IPV6
  case AF_INET6: {
    const struct sockaddr_in6 *sa6 = (const void *)ai->ai_addr;
    const struct in6_addr *ipaddr6 = &sa6->sin6_addr;
    (void)Curl_inet_ntop(ai->ai_family, (const void *)ipaddr6, buf, bufsize);
    break;
  }
#endif
  default:
    break;
  }
}